

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O1

shared_ptr<mocker::nasm::Addr> __thiscall
mocker::nasm::replaceRegs
          (nasm *this,shared_ptr<mocker::nasm::Addr> *addr,RegMap<std::shared_ptr<Register>_> *mp)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  const_iterator cVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
  _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  bool bVar8;
  __shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2> _Var9;
  shared_ptr<mocker::nasm::Label> sVar10;
  shared_ptr<mocker::nasm::Addr> sVar11;
  shared_ptr<mocker::nasm::Register> reg2;
  shared_ptr<mocker::nasm::Register> p;
  shared_ptr<mocker::nasm::Register> reg1;
  key_type local_a8;
  key_type local_90;
  undefined1 local_79;
  MemoryAddr *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  key_type local_68;
  int local_58;
  int local_54;
  long local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  long local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  _Var9 = (__shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>)
          dyc<mocker::nasm::NumericConstant,std::shared_ptr<mocker::nasm::Addr>const&>
                    ((nasm *)&local_90,addr);
  peVar3 = local_90.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  bVar8 = true;
  if (((__node_type *)
       local_90.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
       (__node_type *)0x0) &&
     (_Var9 = (__shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>)
              dyc<mocker::nasm::LabelAddr,std::shared_ptr<mocker::nasm::Addr>const&>
                        ((nasm *)&local_40,addr), local_40 == 0)) {
    sVar10 = dyc<mocker::nasm::Label,std::shared_ptr<mocker::nasm::Addr>const&>
                       ((nasm *)&local_50,addr);
    _Var7 = sVar10.super___shared_ptr<mocker::nasm::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    bVar8 = local_50 != 0;
    bVar2 = true;
  }
  else {
    _Var7 = _Var9._M_refcount._M_pi;
    bVar2 = false;
  }
  if ((bVar2) && (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    _Var7._M_pi = extraout_RDX;
  }
  if (((__node_type *)peVar3 == (__node_type *)0x0) &&
     (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    _Var7._M_pi = extraout_RDX_00;
  }
  if (local_90.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var7._M_pi = extraout_RDX_01;
  }
  if (bVar8) {
    *(element_type **)this =
         (addr->super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var1 = (addr->super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var1;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
    }
  }
  else {
    dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>const&>((nasm *)&local_90,addr);
    if ((__node_type *)
        local_90.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (__node_type *)0x0) {
      if (local_90.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_90.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      dyc<mocker::nasm::MemoryAddr,std::shared_ptr<mocker::nasm::Addr>const&>
                ((nasm *)&local_90,addr);
      if ((__node_type *)
          local_90.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (__node_type *)0x0) {
        if (local_90.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_90.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/nasm/src/helper.cpp"
                      ,0xb3,
                      "std::shared_ptr<Addr> mocker::nasm::replaceRegs(const std::shared_ptr<Addr> &, const RegMap<std::shared_ptr<Register>> &)"
                     );
      }
      local_68.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)
            &(((_Hash_node_value<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                *)&(local_90.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->identifier)->
             super__Hash_node_value_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>
             )._M_storage._M_storage.__align;
      if ((anon_struct_8_0_00000001_for___align)
          local_68.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (anon_struct_8_0_00000001_for___align)0x0) {
        local_68.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_68.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        local_68.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)&(((_Hash_node_value<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                            *)&(local_90.
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->identifier)->
                         super__Hash_node_value_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>
                         )._M_storage._M_storage + 8);
        if (local_68.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_68.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_68.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_68.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_68.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
      }
      if ((anon_struct_8_0_00000001_for___align)
          local_68.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (anon_struct_8_0_00000001_for___align)0x0) {
        local_a8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(element_type **)
              &(((_Hash_node_value<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                  *)&(local_90.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->identifier)->
               super__Hash_node_value_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>
               )._M_storage._M_storage.__align;
        local_a8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)&(((_Hash_node_value<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                            *)&(local_90.
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->identifier)->
                         super__Hash_node_value_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>
                         )._M_storage._M_storage + 8);
      }
      else {
        cVar4 = std::
                _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&mp->_M_h,&local_68);
        if (cVar4.
            super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          local_a8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               local_68.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
          local_a8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               local_68.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
        }
        else {
          local_a8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(element_type **)
                ((long)cVar4.
                       super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                       ._M_cur + 0x18);
          local_a8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                ((long)cVar4.
                       super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                       ._M_cur + 0x20);
        }
      }
      if (local_a8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_a8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_a8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_a8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_a8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_68.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_a8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_68.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 &local_a8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (local_a8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_a8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)
            ((long)&(((_Hash_node_value<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                       *)&(local_90.
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->identifier)->
                    super__Hash_node_value_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>
                    )._M_storage._M_storage + 0x10);
      if ((MemoryAddr *)
          local_a8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (MemoryAddr *)0x0) {
        local_a8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_a8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        local_a8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)&(((_Hash_node_value<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                            *)&(local_90.
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->identifier)->
                         super__Hash_node_value_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>
                         )._M_storage._M_storage + 0x18);
        if (local_a8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_a8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_a8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_a8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_a8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
      }
      _Var6._M_cur = (__node_type *)
                     local_90.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
      if (((MemoryAddr *)
           local_a8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
           (MemoryAddr *)0x0) ||
         (_Var6._M_cur = (__node_type *)
                         std::
                         _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         ::find(&mp->_M_h,&local_a8), _Var6._M_cur != (__node_type *)0x0)) {
        local_78 = *(MemoryAddr **)
                    ((long)&((_Var6._M_cur)->
                            super__Hash_node_value<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>
                            ._M_storage._M_storage + 0x10);
        local_70._M_pi =
             *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)&((_Var6._M_cur)->
                      super__Hash_node_value<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                      ).
                      super__Hash_node_value_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>
                      ._M_storage._M_storage + 0x18);
      }
      else {
        local_78 = (MemoryAddr *)
                   local_a8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
        local_70._M_pi =
             local_a8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      }
      if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_70._M_pi)->_M_use_count = (local_70._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_70._M_pi)->_M_use_count = (local_70._M_pi)->_M_use_count + 1;
        }
      }
      local_a8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_78;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_a8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,&local_70);
      if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70._M_pi);
      }
      local_54 = (int)(((_Hash_node_value<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                         *)&(local_90.
                             super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->identifier)->super__Hash_node_code_cache<true>)._M_hash_code;
      local_58 = *(int *)&(((__node_type *)
                           ((long)local_90.
                                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + 0x30))->super__Hash_node_base)._M_nxt;
      local_78 = (MemoryAddr *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<mocker::nasm::MemoryAddr,std::allocator<mocker::nasm::MemoryAddr>,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Register>&,int,int>
                (&local_70,&local_78,(allocator<mocker::nasm::MemoryAddr> *)&local_79,&local_68,
                 &local_a8,&local_54,&local_58);
      _Var7._M_pi = local_70._M_pi;
      *(MemoryAddr **)this = local_78;
      *(undefined8 *)(this + 8) = 0;
      local_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var7._M_pi;
      _Var7._M_pi = extraout_RDX_03;
      if (local_a8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var7._M_pi = extraout_RDX_04;
      }
      if (local_68.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var7._M_pi = extraout_RDX_05;
      }
    }
    else {
      cVar4 = std::
              _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&mp->_M_h,&local_90);
      _Var5._M_pi = local_90.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      if (cVar4.
          super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        local_90.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(element_type **)
              ((long)cVar4.
                     super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                     ._M_cur + 0x18);
        _Var5._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                       ((long)cVar4.
                              super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                              ._M_cur + 0x20);
      }
      _Var7._M_pi = extraout_RDX_02;
      if (_Var5._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
        if (__libc_single_threaded == '\0') {
          LOCK();
          (_Var5._M_pi)->_M_use_count = (_Var5._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (_Var5._M_pi)->_M_use_count = (_Var5._M_pi)->_M_use_count + 1;
        }
      }
      *(element_type **)this =
           local_90.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var5._M_pi;
    }
    if (local_90.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_90.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var7._M_pi = extraout_RDX_06;
    }
  }
  sVar11.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  sVar11.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::nasm::Addr>)
         sVar11.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Addr> replaceRegs(const std::shared_ptr<Addr> &addr,
                                  const RegMap<std::shared_ptr<Register>> &mp) {
  auto getIfExists = [&mp](const std::shared_ptr<Register> &p) {
    auto iter = mp.find(p);
    if (iter == mp.end())
      return p;
    return iter->second;
  };
  if (dyc<NumericConstant>(addr) || dyc<LabelAddr>(addr) || dyc<Label>(addr))
    return addr;
  if (auto p = dyc<Register>(addr))
    return getIfExists(p);
  if (auto p = dyc<MemoryAddr>(addr)) {
    auto reg1 = dyc<Register>(p->getReg1());
    reg1 = reg1 ? getIfExists(reg1) : p->getReg1();
    auto reg2 = dyc<Register>(p->getReg2());
    reg2 = reg2 ? getIfExists(reg2) : p->getReg2();
    return std::make_shared<MemoryAddr>(reg1, reg2, p->getScale(),
                                        p->getNumber());
  }
  assert(false);
}